

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture_fuzz.cpp
# Opt level: O0

bool __thiscall capture_fuzz::FuzzPacket(capture_fuzz *this,uint8_t *packet,size_t packet_length)

{
  uint64_t uVar1;
  uint8_t *puVar2;
  ulong local_60;
  size_t i;
  size_t y;
  size_t x;
  uint8_t *new_buf;
  size_t new_size;
  uint64_t random_pilot;
  bool ret;
  size_t packet_length_local;
  uint8_t *packet_local;
  capture_fuzz *this_local;
  
  this_local._7_1_ = true;
  uVar1 = picoquic_test_random(&this->fuzz_random_context);
  if (packet_length < 8) {
    this_local._7_1_ = false;
  }
  else {
    if (this->buffer_size < packet_length) {
      puVar2 = (uint8_t *)operator_new__(packet_length);
      if (puVar2 == (uint8_t *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        if ((this->buffer != (uint8_t *)0x0) && (this->buffer != (uint8_t *)0x0)) {
          operator_delete__(this->buffer);
        }
        this->buffer = puVar2;
        this->buffer_size = packet_length;
      }
    }
    if (this_local._7_1_ != false) {
      memcpy(this->buffer,packet,packet_length);
      new_size = picoquic_test_random(&this->fuzz_random_context);
      for (local_60 = 0;
          local_60 < (uVar1 >> 0x11 & 7) + 1 && uVar1 % packet_length + local_60 < packet_length;
          local_60 = local_60 + 1) {
        packet[local_60] = (uint8_t)new_size;
        new_size = new_size >> 8;
      }
      this->fuzzed_length = packet_length;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool capture_fuzz::FuzzPacket(uint8_t * packet, size_t packet_length)
{
    bool ret = true;
    uint64_t random_pilot = picoquic_test_random(&fuzz_random_context);

    if (packet_length < 8) {
        return false;
    }

    /* Reallocate the capture buffer */
    if (packet_length > buffer_size)
    {
        size_t new_size = packet_length;
        uint8_t * new_buf = new uint8_t[packet_length];
        if (new_buf == NULL)
        {
            ret = false;
        }
        else
        {
            if (buffer != NULL)
            {
                delete[] buffer;
            }
            buffer = new_buf;
            buffer_size = new_size;
        }
    }

    if (ret) {
        /* smash some random location in the packet */
        size_t x = random_pilot % packet_length;
        size_t y = (size_t)((random_pilot >> 17) & 0x07) + 1;

        memcpy(buffer, packet, packet_length);

        random_pilot = picoquic_test_random(&fuzz_random_context);
        for (size_t i = 0; i < y && x + i < packet_length; i++) {
            packet[i] = (uint8_t)(random_pilot & 0xFF);
            random_pilot >>= 8;
        }

        fuzzed_length = packet_length;
    }

    return ret;
}